

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSwitch.c
# Opt level: O1

Vec_Int_t * Gia_ManComputeSwitchProbs(Gia_Man_t *pGia,int nFrames,int nPref,int fProbOne)

{
  int iVar1;
  char *pcVar2;
  Vec_Int_t *pVVar3;
  Gia_ParSwi_t *pPars;
  Gia_ParSwi_t Pars;
  Gia_ParSwi_t local_38;
  
  local_38.nPref = 0x10;
  local_38.nRandPiFactor = 0;
  local_38.fProbOne = 0;
  local_38.fProbTrans = 1;
  local_38.fVerbose = 0;
  local_38.nIters = nFrames;
  local_38.nWords = 10;
  pcVar2 = Abc_FrameReadFlag("seqsimframes");
  if (pcVar2 != (char *)0x0) {
    pcVar2 = Abc_FrameReadFlag("seqsimframes");
    iVar1 = atoi(pcVar2);
    local_38.nIters = iVar1;
  }
  local_38.fProbOne = (int)(fProbOne != 0);
  local_38.fProbTrans = (int)(fProbOne == 0);
  local_38.nPref = nPref;
  pVVar3 = Gia_ManSwiSimulate(pGia,&local_38);
  return pVVar3;
}

Assistant:

Vec_Int_t * Gia_ManComputeSwitchProbs( Gia_Man_t * pGia, int nFrames, int nPref, int fProbOne )
{
    Gia_ParSwi_t Pars, * pPars = &Pars;
    // set the default parameters
    Gia_ManSetDefaultParamsSwi( pPars ); 
    // override some of the defaults
    pPars->nIters   = nFrames;  // set number of total timeframes
    if ( Abc_FrameReadFlag("seqsimframes") )
        pPars->nIters = atoi( Abc_FrameReadFlag("seqsimframes") );
    pPars->nPref    = nPref;    // set number of first timeframes to skip  
    // decide what should be computed
    if ( fProbOne )
    {
        // if the user asked to compute propability of 1, we do not need transition information
        pPars->fProbOne   = 1;  // enable computing probabiblity of being one
        pPars->fProbTrans = 0;  // disable computing transition probability 
    }
    else
    {
        // if the user asked for transition propabability, we do not need to compute probability of 1
        pPars->fProbOne   = 0;  // disable computing probabiblity of being one
        pPars->fProbTrans = 1;  // enable computing transition probability 
    }
    // perform the computation of switching activity
    return Gia_ManSwiSimulate( pGia, pPars );
}